

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_send_fatal_alert(SSL *ssl,uint8_t alert)

{
  uint8_t alert_local;
  SSL *ssl_local;
  
  if ((*(ushort *)&ssl->s3->field_0xdc >> 10 & 1) == 0) {
    ssl_local._4_4_ = bssl::ssl_send_alert_impl(ssl,2,(uint)alert);
  }
  else if ((ssl->s3->send_alert[0] == '\x02') && (ssl->s3->send_alert[1] == alert)) {
    ssl_local._4_4_ = (*ssl->method->dispatch_alert)(ssl);
  }
  else {
    ERR_put_error(0x10,0,0xc2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x435);
    ssl_local._4_4_ = -1;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_send_fatal_alert(SSL *ssl, uint8_t alert) {
  if (ssl->s3->alert_dispatch) {
    if (ssl->s3->send_alert[0] != SSL3_AL_FATAL ||
        ssl->s3->send_alert[1] != alert) {
      // We are already attempting to write a different alert.
      OPENSSL_PUT_ERROR(SSL, SSL_R_PROTOCOL_IS_SHUTDOWN);
      return -1;
    }
    return ssl->method->dispatch_alert(ssl);
  }

  return ssl_send_alert_impl(ssl, SSL3_AL_FATAL, alert);
}